

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgBuiltinFunctions.hpp
# Opt level: O0

bool rsg::LogOp::transformValueRange(float outMin,float outMax,float *inMin,float *inMax)

{
  float fVar1;
  float rangeMax;
  float rangeMin;
  float *inMax_local;
  float *inMin_local;
  float outMax_local;
  float outMin_local;
  
  if ((outMax < 0.1) || (6.0 < outMin)) {
    outMax_local._3_1_ = false;
  }
  else {
    fVar1 = deFloatMax(outMin,0.1);
    fVar1 = deFloatExp(fVar1);
    *inMin = fVar1;
    fVar1 = deFloatMin(outMax,6.0);
    fVar1 = deFloatExp(fVar1);
    *inMax = fVar1;
    outMax_local._3_1_ = true;
  }
  return outMax_local._3_1_;
}

Assistant:

static inline bool transformValueRange (float outMin, float outMax, float& inMin, float& inMax)
	{
		// Limited due to accuracy reasons, should be -inf..+inf
		const float rangeMin = 0.1f;
		const float rangeMax = 6.0f;

		if (outMax < rangeMin || outMin > rangeMax)
			return false; // Out of range

		inMin = deFloatExp(deFloatMax(outMin, rangeMin));
		inMax = deFloatExp(deFloatMin(outMax, rangeMax));

		return true;
	}